

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

float __thiscall pbrt::MIPMap::Lookup<float>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  float *__result;
  float *pfVar5;
  long lVar6;
  int level;
  float fVar7;
  float fVar8;
  Float FVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  float fVar22;
  Tuple2<pbrt::Vector2,_float> dst1_00;
  Vector2f local_38;
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar20._8_56_ = in_register_00001248;
  auVar20._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar15._8_56_ = in_register_00001208;
  auVar15._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar11 = auVar15._0_16_;
  auVar18 = auVar20._0_16_;
  if ((this->options).filter != EWA) {
    auVar18 = vmovlhps_avx(auVar11,auVar18);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    local_28 = vandps_avx512vl(auVar18,auVar11);
    pfVar5 = (float *)local_28;
    lVar6 = 4;
    do {
      if (*pfVar5 < *(float *)(local_28 + lVar6)) {
        pfVar5 = (float *)(local_28 + lVar6);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    fVar7 = Lookup<float>(this,st,*pfVar5 + *pfVar5);
    return fVar7;
  }
  auVar12._0_4_ =
       dst0.super_Tuple2<pbrt::Vector2,_float>.x * dst0.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar12._4_4_ =
       dst0.super_Tuple2<pbrt::Vector2,_float>.y * dst0.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar12._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
  auVar12._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
  auVar12 = vhaddps_avx(auVar12,auVar12);
  auVar21._0_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar21._4_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar21._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
  auVar21._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
  auVar21 = vhaddps_avx(auVar21,auVar21);
  auVar19 = auVar11;
  if (auVar21._0_4_ <= auVar12._0_4_) {
    auVar19 = auVar18;
    auVar18 = auVar11;
  }
  dst1_00 = auVar19._0_8_;
  auVar13._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar13._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar13._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar13._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar11 = vhaddps_avx(auVar13,auVar13);
  if (auVar11._0_4_ < 0.0) {
    auVar16._0_4_ = sqrtf(auVar11._0_4_);
    auVar16._4_60_ = extraout_var;
    auVar11 = auVar16._0_16_;
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
  }
  fVar7 = auVar19._0_4_;
  auVar14._0_4_ = fVar7 * fVar7;
  fVar10 = auVar19._4_4_;
  auVar14._4_4_ = fVar10 * fVar10;
  auVar14._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar14._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar12 = vhaddps_avx(auVar14,auVar14);
  if (auVar12._0_4_ < 0.0) {
    auVar17._0_4_ = sqrtf(auVar12._0_4_);
    auVar17._4_60_ = extraout_var_00;
    auVar12 = auVar17._0_16_;
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
  }
  fVar8 = auVar12._0_4_;
  fVar22 = fVar8 * (this->options).maxAnisotropy;
  uVar1 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar12,1);
  uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar22),auVar11,1);
  bVar4 = (bool)((byte)uVar1 & (byte)uVar2 & 1);
  fVar22 = auVar11._0_4_ / fVar22;
  if (bVar4 != false) {
    dst1_00.x = fVar7 * fVar22;
    dst1_00.y = fVar10 * fVar22;
  }
  fVar7 = (float)((uint)bVar4 * (int)(fVar8 * fVar22) + (uint)!bVar4 * (int)fVar8);
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    FVar9 = Bilerp<float>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
    return FVar9;
  }
  sVar3 = (this->pyramid).nStored;
  fVar7 = logf(fVar7);
  auVar12 = vmaxss_avx(ZEXT416((uint)(fVar7 * 1.442695 + (float)((int)sVar3 + -1))),
                       ZEXT816(0) << 0x40);
  auVar11 = vroundss_avx(auVar12,auVar12,9);
  level = (int)auVar11._0_4_;
  auVar19._0_4_ = (int)auVar11._0_4_;
  auVar19._4_4_ = (int)auVar11._4_4_;
  auVar19._8_4_ = (int)auVar11._8_4_;
  auVar19._12_4_ = (int)auVar11._12_4_;
  auVar11 = vcvtdq2ps_avx(auVar19);
  fVar7 = auVar12._0_4_ - auVar11._0_4_;
  local_38.super_Tuple2<pbrt::Vector2,_float> = auVar18._0_8_;
  fVar10 = EWA<float>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_38,
                      (Vector2f)dst1_00);
  fVar22 = EWA<float>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_38,
                      (Vector2f)dst1_00);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar7)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)(1.0 - fVar7)));
  return auVar18._0_4_;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}